

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

t_float template_getfloat(t_template *x,t_symbol *fieldname,t_word *wp,int loud)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *fmt;
  int type;
  int onset;
  t_symbol *arraytype;
  int local_30;
  int local_2c;
  t_symbol *local_28;
  
  iVar1 = template_find_field(x,fieldname,&local_2c,&local_30,&local_28);
  if (iVar1 == 0) {
    if (loud == 0) {
      return 0.0;
    }
    pcVar3 = x->t_sym->s_name;
    pcVar2 = fieldname->s_name;
    fmt = "%s.%s: no such field";
  }
  else {
    if (local_30 == 0) {
      return *(t_float *)((long)wp + (long)local_2c);
    }
    if (loud == 0) {
      return 0.0;
    }
    pcVar3 = x->t_sym->s_name;
    pcVar2 = fieldname->s_name;
    fmt = "%s.%s: not a number";
  }
  pd_error((void *)0x0,fmt,pcVar3,pcVar2);
  return 0.0;
}

Assistant:

t_float template_getfloat(t_template *x, t_symbol *fieldname, t_word *wp,
    int loud)
{
    int onset, type;
    t_symbol *arraytype;
    t_float val = 0;
    if (template_find_field(x, fieldname, &onset, &type, &arraytype))
    {
        if (type == DT_FLOAT)
            val = *(t_float *)(((char *)wp) + onset);
        else if (loud) pd_error(0, "%s.%s: not a number",
            x->t_sym->s_name, fieldname->s_name);
    }
    else if (loud) pd_error(0, "%s.%s: no such field",
        x->t_sym->s_name, fieldname->s_name);
    return (val);
}